

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool gl4cts::EnhancedLayouts::Utils::checkProgramStage
               (Program *program,ProgramInterface *program_interface,STAGES stage,bool check_inputs,
               bool check_outputs,bool check_uniforms,bool check_ssbs,stringstream *stream)

{
  bool bVar1;
  ShaderInterface *pSVar2;
  undefined7 in_register_00000009;
  bool bVar3;
  pointer ppVVar4;
  
  pSVar2 = ProgramInterface::GetShaderInterface(program_interface,stage);
  bVar3 = true;
  if ((int)CONCAT71(in_register_00000009,check_inputs) != 0) {
    for (ppVVar4 = (pSVar2->m_inputs).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar4 !=
        (pSVar2->m_inputs).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVVar4 = ppVVar4 + 1) {
      bVar1 = checkVarying(program,*ppVVar4,stream,true);
      bVar3 = (bool)(bVar3 & bVar1);
    }
  }
  if (check_outputs) {
    for (ppVVar4 = (pSVar2->m_outputs).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar4 !=
        (pSVar2->m_outputs).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVVar4 = ppVVar4 + 1) {
      bVar1 = checkVarying(program,*ppVVar4,stream,false);
      bVar3 = (bool)(bVar3 & bVar1);
    }
  }
  if (check_uniforms) {
    for (ppVVar4 = (pSVar2->m_uniforms).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar4 !=
        (pSVar2->m_uniforms).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVVar4 = ppVVar4 + 1) {
      bVar1 = checkUniform(program,*ppVVar4,stream);
      bVar3 = (bool)(bVar3 & bVar1);
    }
  }
  if (check_ssbs) {
    for (ppVVar4 = (pSVar2->m_ssb_blocks).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar4 !=
        (pSVar2->m_ssb_blocks).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVVar4 = ppVVar4 + 1) {
      bVar1 = checkSSB(program,*ppVVar4,stream);
      bVar3 = (bool)(bVar3 & bVar1);
    }
  }
  return bVar3;
}

Assistant:

bool checkProgramStage(Program& program, const ProgramInterface& program_interface, Utils::Shader::STAGES stage,
					   bool check_inputs, bool check_outputs, bool check_uniforms, bool check_ssbs,
					   std::stringstream& stream)
{
	typedef Variable::PtrVector::const_iterator const_iterator;

	const ShaderInterface& interface = program_interface.GetShaderInterface(stage);

	bool result = true;

	/* Inputs */
	if (true == check_inputs)
	{
		const Variable::PtrVector& inputs = interface.m_inputs;

		for (const_iterator it = inputs.begin(); it != inputs.end(); ++it)
		{
			if (false == checkVarying(program, **it, stream, true))
			{
				result = false;
			}
		}
	}

	/* Outputs */
	if (true == check_outputs)
	{
		const Variable::PtrVector& outputs = interface.m_outputs;

		for (const_iterator it = outputs.begin(); it != outputs.end(); ++it)
		{
			if (false == checkVarying(program, **it, stream, false))
			{
				result = false;
			}
		}
	}

	/* Uniforms */
	if (true == check_uniforms)
	{
		const Variable::PtrVector& uniforms = interface.m_uniforms;

		for (const_iterator it = uniforms.begin(); it != uniforms.end(); ++it)
		{
			if (false == checkUniform(program, **it, stream))
			{
				result = false;
			}
		}
	}

	/* SSBs */
	if (true == check_ssbs)
	{
		const Variable::PtrVector& ssbs = interface.m_ssb_blocks;

		for (const_iterator it = ssbs.begin(); it != ssbs.end(); ++it)
		{
			if (false == checkSSB(program, **it, stream))
			{
				result = false;
			}
		}
	}

	return result;
}